

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O3

bit_array_impl * __thiscall
baryonyx::bit_array_impl::operator=(bit_array_impl *this,bit_array_impl *other)

{
  unsigned_long *puVar1;
  uint uVar2;
  int __n2;
  uint uVar3;
  unsigned_long *__s;
  ulong __n;
  
  if (this == other) {
    return this;
  }
  if (this->m_size == other->m_size) {
    uVar3 = this->m_block_size;
    uVar2 = other->m_block_size;
    if (uVar3 == other->m_block_size) goto LAB_00139ff6;
  }
  else {
    uVar2 = other->m_block_size;
  }
  uVar3 = uVar2;
  this->m_size = other->m_size;
  this->m_block_size = uVar3;
  __n = 0xffffffffffffffff;
  if (-1 < (int)uVar3) {
    __n = (long)(int)uVar3 * 8;
  }
  __s = (unsigned_long *)operator_new__(__n);
  memset(__s,0,__n);
  puVar1 = (this->m_data)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  (this->m_data)._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = __s;
  if (puVar1 != (unsigned_long *)0x0) {
    operator_delete__(puVar1);
    uVar3 = this->m_block_size;
  }
LAB_00139ff6:
  if (0 < (int)uVar3) {
    memmove((this->m_data)._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
            (other->m_data)._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,(ulong)uVar3 << 3);
  }
  return this;
}

Assistant:

bit_array_impl& operator=(const bit_array_impl& other)
    {
        if (this != &other) {
            if (!(m_size == other.m_size &&
                  m_block_size == other.m_block_size)) {
                m_size = other.m_size;
                m_block_size = other.m_block_size;
                m_data = std::make_unique<underlying_type[]>(m_block_size);
            }
            std::copy_n(other.m_data.get(), m_block_size, m_data.get());
        }

        return *this;
    }